

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void lws_pt_destroy(lws_context_per_thread *pt)

{
  lws_foreign_thread_pollfd *plVar1;
  lws *wsi_00;
  lws *wsi;
  lws_context_per_thread *vpt;
  lws_foreign_thread_pollfd *next;
  lws_foreign_thread_pollfd *ftp;
  lws_context_per_thread *pt_local;
  
  if (((byte)pt->field_0x187 >> 5 & 1) == 0) {
    pt->field_0x187 = pt->field_0x187 & 0xef;
    next = pt->foreign_pfd_list;
    while (next != (lws_foreign_thread_pollfd *)0x0) {
      plVar1 = next->next;
      lws_realloc(next,0,"lws_free");
      next = plVar1;
    }
    pt->foreign_pfd_list = (lws_foreign_thread_pollfd *)0x0;
    if (pt->pipe_wsi != (lws *)0x0) {
      lws_destroy_event_pipe(pt->pipe_wsi);
    }
    pt->pipe_wsi = (lws *)0x0;
    while ((pt->fds_count != 0 &&
           (wsi_00 = wsi_from_fd(pt->context,pt->fds->fd), wsi_00 != (lws *)0x0))) {
      lws_close_free_wsi(wsi_00,LWS_CLOSE_STATUS_NOSTATUS_CONTEXT_DESTROY,"ctx destroy");
    }
    pt->field_0x187 = pt->field_0x187 & 0xdf | 0x20;
    _lws_log(8,"%s: pt destroyed\n","lws_pt_destroy");
    return;
  }
  __assert_fail("!pt->is_destroyed",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core/context.c"
                ,0x477,"void lws_pt_destroy(struct lws_context_per_thread *)");
}

Assistant:

static void
lws_pt_destroy(struct lws_context_per_thread *pt)
{
	volatile struct lws_foreign_thread_pollfd *ftp, *next;
	volatile struct lws_context_per_thread *vpt;

	assert(!pt->is_destroyed);
	pt->destroy_self = 0;

	vpt = (volatile struct lws_context_per_thread *)pt;
	ftp = vpt->foreign_pfd_list;
	while (ftp) {
		next = ftp->next;
		lws_free((void *)ftp);
		ftp = next;
	}
	vpt->foreign_pfd_list = NULL;

	if (pt->pipe_wsi)
		lws_destroy_event_pipe(pt->pipe_wsi);
	pt->pipe_wsi = NULL;

	while (pt->fds_count) {
		struct lws *wsi = wsi_from_fd(pt->context, pt->fds[0].fd);

		if (!wsi)
			break;

		lws_close_free_wsi(wsi,
				LWS_CLOSE_STATUS_NOSTATUS_CONTEXT_DESTROY,
				"ctx destroy"
				/* no protocol close */);
	}
	lws_pt_mutex_destroy(pt);

	pt->is_destroyed = 1;

	lwsl_info("%s: pt destroyed\n", __func__);
}